

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

void canvas_savedeclarationsto(_glist *x,_binbuf *b)

{
  _glist *x_00;
  t_pd p_Var1;
  t_symbol *ptVar2;
  
  for (x_00 = (_glist *)x->gl_list; x_00 != (_glist *)0x0;
      x_00 = (_glist *)(x_00->gl_obj).te_g.g_next) {
    p_Var1 = (x_00->gl_obj).te_g.g_pd;
    if (p_Var1 == declare_class) {
      ptVar2 = gensym("#X");
      binbuf_addv(b,"s",ptVar2);
      binbuf_addbinbuf(b,(x_00->gl_obj).te_binbuf);
      binbuf_addv(b,";");
    }
    else if (((p_Var1 == canvas_class) || (p_Var1 == array_define_class)) &&
            ((pd_compatibilitylevel < 0x2f || (x_00->gl_env == (_canvasenvironment *)0x0)))) {
      canvas_savedeclarationsto(x_00,b);
    }
  }
  return;
}

Assistant:

void canvas_savedeclarationsto(t_canvas *x, t_binbuf *b)
{
    t_gobj *y;

    for (y = x->gl_list; y; y = y->g_next)
    {
        if (pd_class(&y->g_pd) == declare_class)
        {
            binbuf_addv(b, "s", gensym("#X"));
            binbuf_addbinbuf(b, ((t_declare *)y)->x_obj.te_binbuf);
            binbuf_addv(b, ";");
        }
            /* before 0.47 we also allowed abstractions to write out to the
            parent's declarations; now we only allow non-abstraction subpatches
            to do so. */
        else if (pd_checkglist(&y->g_pd) &&
            (pd_compatibilitylevel < 47 || !canvas_isabstraction((t_canvas *)y)))
                canvas_savedeclarationsto((t_canvas *)y, b);
    }
}